

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::FinalizeFuncInfos(ByteCodeGenerator *this)

{
  ParseableFunctionInfo *this_00;
  code *pcVar1;
  bool bVar2;
  Attributes AVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  Iterator local_40;
  
  pSVar6 = this->funcInfosToFinalize;
  if (pSVar6 != (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    local_40.list = &pSVar6->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>;
    local_40.current = (NodeBase *)pSVar6;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar6 == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        pSVar6 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      local_40.current =
           (pSVar6->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      if ((SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
          local_40.list) break;
      ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pSVar6 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      if (((*ppFVar5)->field_0xb4 & 1) != 0) {
        this_00 = (*ppFVar5)->byteCodeFunction;
        AVar3 = Js::FunctionProxy::GetAttributes(&this_00->super_FunctionProxy);
        Js::FunctionProxy::SetAttributes(&this_00->super_FunctionProxy,AVar3 | CanDefer);
        pSVar6 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
    }
    this->funcInfosToFinalize = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  return;
}

Assistant:

void ByteCodeGenerator::FinalizeFuncInfos()
{
    if (this->funcInfosToFinalize == nullptr)
    {
        return;
    }

    FOREACH_SLIST_ENTRY(FuncInfo*, funcInfo, this->funcInfosToFinalize)
    {
        if (funcInfo->canDefer)
        {
            funcInfo->byteCodeFunction->SetAttributes((Js::FunctionInfo::Attributes)(funcInfo->byteCodeFunction->GetAttributes() | Js::FunctionInfo::Attributes::CanDefer));
        }
    }
    NEXT_SLIST_ENTRY;

    this->funcInfosToFinalize = nullptr;
}